

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::Detail::
         rangeToString<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,double>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,double>>>
                   (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                          last)

{
  bool bVar1;
  string *in_RDI;
  ReusableStringStream rss;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string local_80 [16];
  ReusableStringStream *in_stack_ffffffffffffff90;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  _Self local_18;
  _Self local_10 [2];
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(local_10,&local_18);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                 *)0x271cb9);
    stringify<std::pair<std::__cxx11::string_const,double>>(in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->first);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)in_stack_ffffffffffffff60);
    while (bVar1 = std::operator!=(local_10,&local_18), bVar1) {
      in_stack_ffffffffffffff60 =
           ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                   *)0x271d33);
      stringify<std::pair<std::__cxx11::string_const,double>>(in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->first);
      std::__cxx11::string::~string(local_80);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                    *)in_stack_ffffffffffffff60);
    }
  }
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [3])in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }